

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O2

DdNode * Aig_ManInitStateVarMap(DdManager *dd,Aig_Man_t *p,int fVerbose)

{
  int iVar1;
  DdNode **ppDVar2;
  DdNode **x;
  DdNode **y;
  DdNode *pDVar3;
  DdNode *n;
  size_t __size;
  long lVar4;
  
  __size = (long)dd->size << 3;
  x = (DdNode **)malloc(__size);
  y = (DdNode **)malloc(__size);
  n = dd->one;
  Cudd_Ref(n);
  for (lVar4 = 0; lVar4 < p->nRegs; lVar4 = lVar4 + 1) {
    Vec_PtrEntry(p->vCis,p->nTruePis + (int)lVar4);
    ppDVar2 = dd->vars;
    iVar1 = p->nTruePis;
    pDVar3 = ppDVar2[iVar1 + lVar4];
    x[lVar4] = pDVar3;
    y[lVar4] = ppDVar2[p->nRegs + iVar1 + (int)lVar4];
    pDVar3 = Cudd_bddAnd(dd,n,(DdNode *)((ulong)pDVar3 ^ 1));
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,n);
    n = pDVar3;
  }
  Cudd_SetVarMap(dd,x,y,p->nRegs);
  free(x);
  free(y);
  Cudd_Deref(n);
  return n;
}

Assistant:

DdNode * Aig_ManInitStateVarMap( DdManager * dd, Aig_Man_t * p, int fVerbose )
{
    DdNode ** pbVarsX, ** pbVarsY;
    DdNode * bTemp, * bProd;
    Aig_Obj_t * pLatch;
    int i;

    // set the variable mapping for Cudd_bddVarMap()
    pbVarsX = ABC_ALLOC( DdNode *, dd->size );
    pbVarsY = ABC_ALLOC( DdNode *, dd->size );
    bProd = (dd)->one;         Cudd_Ref( bProd );
    Saig_ManForEachLo( p, pLatch, i )
    {
        pbVarsX[i] = dd->vars[ Saig_ManPiNum(p) + i ];
        pbVarsY[i] = dd->vars[ Saig_ManCiNum(p) + i ];
        // get the initial value of the latch
        bProd = Cudd_bddAnd( dd, bTemp = bProd, Cudd_Not(pbVarsX[i]) );      Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bTemp ); 
    }
    Cudd_SetVarMap( dd, pbVarsX, pbVarsY, Saig_ManRegNum(p) );
    ABC_FREE( pbVarsX );
    ABC_FREE( pbVarsY );

    Cudd_Deref( bProd );
    return bProd;
}